

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_kvtree_write_locking.c
# Opt level: O0

int spawn_processes(int use_locking)

{
  __pid_t _Var1;
  int __status;
  int local_44;
  int failures;
  pid_t child_pid;
  int status;
  pid_t pids [8];
  int i;
  int rc;
  int use_locking_local;
  
  memset(&child_pid,0,0x20);
  local_44 = 0;
  pids[7] = 0;
  while( true ) {
    if (7 < pids[7]) {
      for (pids[7] = 0; pids[7] < 8; pids[7] = pids[7] + 1) {
        waitpid((&child_pid)[pids[7]],&failures,0);
        failures = (int)(failures & 0xff00U) >> 8;
        if (failures != 0) {
          local_44 = local_44 + 1;
        }
      }
      return local_44;
    }
    _Var1 = fork();
    if (_Var1 == 0) break;
    (&child_pid)[pids[7]] = _Var1;
    pids[7] = pids[7] + 1;
  }
  process_func(use_locking);
  __status = process_func(use_locking);
  exit(__status);
}

Assistant:

int spawn_processes(int use_locking)
{
  int rc;
  int i;
  pid_t pids[PROCESSES] = {0};
  int status;
  pid_t child_pid;
  int failures = 0;

  /* Wait for the threads to finish */
  for (i = 0; i < PROCESSES; i++) {
    child_pid = fork();
    if (child_pid == 0) {
      /* We're a child. */
      process_func(use_locking);

      /* Try to write our kvtree and pass our return code to exit() */
      rc = process_func(use_locking);
      exit(rc);
      break;
    } else {
      pids[i] = child_pid;
      /* We're the original process (parent).  Keep spawning children */
    }
  }

  for (i = 0; i < PROCESSES; i++) {
    waitpid(pids[i], &status, 0);
    status = WEXITSTATUS(status);
    if (status != 0) {
      failures++;
    }
  }
  return failures;
}